

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O1

Amap_Cut_t * Amap_ManSetupPis(Amap_Man_t *p)

{
  uint *puVar1;
  Amap_Cut_t *pAVar2;
  long lVar3;
  Amap_Cut_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  
  pAVar2 = (Amap_Cut_t *)malloc((long)p->nObjs[2] << 3);
  pVVar5 = p->vPis;
  if (0 < pVVar5->nSize) {
    lVar3 = 0;
    pAVar4 = pAVar2;
    do {
      puVar1 = (uint *)pVVar5->pArray[lVar3];
      *pAVar4 = (Amap_Cut_t)0x20000;
      pAVar4[1] = (Amap_Cut_t)(*puVar1 >> 2 & 0xfffffffe);
      *(Amap_Cut_t **)(puVar1 + 10) = pAVar4;
      puVar1[3] = 1;
      puVar1[0xc] = 0x3f800000;
      lVar3 = lVar3 + 1;
      pVVar5 = p->vPis;
      pAVar4 = pAVar4 + 2;
    } while (lVar3 < pVVar5->nSize);
  }
  return pAVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates new cut and adds it to storage.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Amap_Cut_t * Amap_ManSetupPis( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    Amap_Cut_t * pCut;
    int i, nBytes = sizeof(Amap_Cut_t) + sizeof(int);
    char * pBuffer = ABC_ALLOC( char, Amap_ManPiNum(p) * nBytes );
    Amap_ManForEachPi( p, pObj, i )
    {
        pCut = (Amap_Cut_t *)( pBuffer + i*nBytes );
        pCut->iMat = 0;
        pCut->fInv = 0;
        pCut->nFans = 1;
        pCut->Fans[0] = Abc_Var2Lit( pObj->Id, 0 );
        pObj->pData = pCut;
        pObj->nCuts = 1;
        pObj->EstRefs = (float)1.0;
    }
    return (Amap_Cut_t *)pBuffer;
}